

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftmgr.c
# Opt level: O0

void ftmgr_fill(ftmgr *ftmgr)

{
  uint32_t uVar1;
  uint8_t *puVar2;
  uint uVar3;
  char cVar4;
  byte bVar5;
  ssize_t sVar6;
  uint8_t *__ptr;
  uint32_t __v;
  uint8_t seq;
  int rn;
  ftmgr *ftmgr_local;
  
  if (ftmgr->fd != -1) {
    while (ftmgr->bitmap != '\0') {
      cVar4 = '\0';
      for (uVar3 = (uint)ftmgr->bitmap; (uVar3 & 1) == 0; uVar3 = uVar3 >> 1 | 0x80000000) {
        cVar4 = cVar4 + '\x01';
      }
      cVar4 = cVar4 + '\x01';
      if (ftmgr->bitmap == 0) {
        cVar4 = '\0';
      }
      bVar5 = cVar4 - 1;
      sVar6 = read(ftmgr->fd,ftmgr->ftq[bVar5].blk + 4,0x1f7);
      if ((int)sVar6 < 1) {
        close(ftmgr->fd);
        ftmgr->fd = -1;
        return;
      }
      ftmgr->bitmap = ftmgr->bitmap & ((byte)(1 << (bVar5 & 0x1f)) ^ 0xff);
      uVar1 = ftmgr->offset;
      puVar2 = ftmgr->ftq[bVar5].blk;
      *puVar2 = (uint8_t)uVar1;
      puVar2[1] = (uint8_t)(uVar1 >> 8);
      puVar2[2] = (uint8_t)(uVar1 >> 0x10);
      puVar2[3] = (uint8_t)(uVar1 >> 0x18);
      ftmgr->offset = (int)sVar6 + ftmgr->offset;
      ftmgr->ftq[bVar5].size = (short)sVar6 + 4;
      cVar4 = ftmgr->tts;
      ftmgr->tts = cVar4 + '\x01';
      ftmgr->ftq[bVar5].tts = cVar4;
    }
  }
  return;
}

Assistant:

void ftmgr_fill(struct ftmgr *ftmgr)
{
    if(ftmgr->fd == -1)
        return;
    while(ftmgr->bitmap) {
        int rn;
        uint8_t seq;
        seq = ffs(ftmgr->bitmap) - 1;

        rn =read(ftmgr->fd, ftmgr->ftq[seq].blk + BLK_HDR_SIZE, BLK_MTU - BLK_HDR_SIZE);
        if(rn <= 0) {
            close(ftmgr->fd);
            ftmgr->fd = -1;
            break;
        }

        ftmgr->bitmap &= ~(1 << seq);
        U32_TO_STREAM(ftmgr->ftq[seq].blk, ftmgr->offset);
        ftmgr->offset += rn;
        ftmgr->ftq[seq].size = rn + BLK_HDR_SIZE;
        ftmgr->ftq[seq].tts = ftmgr->tts++;
    }
}